

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint8_t __thiscall Palette::size(Palette *this)

{
  uint8_t uVar1;
  Palette *this_local;
  
  uVar1 = indexOf(this,0xffff);
  return uVar1;
}

Assistant:

uint8_t Palette::size() const {
	return indexOf(UINT16_MAX);
}